

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntlm.c
# Opt level: O0

CURLcode Curl_auth_create_ntlm_type3_message
                   (Curl_easy *data,char *userp,char *passwdp,ntlmdata *ntlm,bufref *out)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  CURLcode CVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  uchar local_998 [8];
  uchar lmbuffer [24];
  uchar local_978 [8];
  uchar ntbuffer_1 [24];
  uchar local_958 [8];
  uchar ntlmv2hash [24];
  uchar entropy [8];
  uchar ntbuffer [24];
  size_t local_918;
  size_t domlen;
  size_t userlen;
  size_t hostlen;
  size_t domoff;
  size_t useroff;
  size_t hostoff;
  char *domain;
  char *user;
  char host [1025];
  uchar *puStack_4c8;
  _Bool unicode;
  uchar *ntlmv2resp;
  uchar *ptr_ntresp;
  uchar ntresp [24];
  uint ntresplen;
  int ntrespoff;
  uchar lmresp [24];
  uchar local_478 [4];
  int lmrespoff;
  uchar ntlmbuf [1024];
  ulong local_70;
  size_t size;
  CURLcode result;
  bufref *out_local;
  ntlmdata *ntlm_local;
  char *passwdp_local;
  char *userp_local;
  Curl_easy *data_local;
  
  ntresp[0x10] = '\x18';
  ntresp[0x11] = '\0';
  ntresp[0x12] = '\0';
  ntresp[0x13] = '\0';
  ntlmv2resp = (uchar *)&ptr_ntresp;
  puStack_4c8 = (uchar *)0x0;
  bVar8 = (ntlm->flags & 1) != 0;
  memset(&user,0,0x401);
  hostoff = (long)"PK\x01\x02" + 4;
  local_918 = 0;
  memset(&ntresplen,0,0x18);
  memset(&ptr_ntresp,0,0x18);
  domain = strchr(userp,0x5c);
  if (domain == (char *)0x0) {
    domain = strchr(userp,0x2f);
  }
  pcVar3 = userp;
  if (domain != (char *)0x0) {
    local_918 = (long)domain - (long)userp;
    hostoff = (size_t)userp;
    pcVar3 = domain + 1;
  }
  domain = pcVar3;
  domlen = strlen(domain);
  curl_msnprintf((char *)&user,0x401,"%s","WORKSTATION");
  userlen = 0xb;
  if ((ntlm->flags & 0x80000) == 0) {
    CVar4 = Curl_ntlm_core_mk_nt_hash(passwdp,local_978);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    Curl_ntlm_core_lm_resp(local_978,ntlm->nonce,(uchar *)&ptr_ntresp);
    CVar4 = Curl_ntlm_core_mk_lm_hash(passwdp,local_998);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    Curl_ntlm_core_lm_resp(local_998,ntlm->nonce,(uchar *)&ntresplen);
    ntlm->flags = ntlm->flags & 0xfff7ffff;
  }
  else {
    CVar4 = Curl_rand(data,ntlmv2hash + 0x10,8);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = Curl_ntlm_core_mk_nt_hash(passwdp,entropy);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = Curl_ntlm_core_mk_ntlmv2_hash(domain,domlen,(char *)hostoff,local_918,entropy,local_958)
    ;
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = Curl_ntlm_core_mk_lmv2_resp(local_958,ntlmv2hash + 0x10,ntlm->nonce,(uchar *)&ntresplen)
    ;
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = Curl_ntlm_core_mk_ntlmv2_resp
                      (local_958,ntlmv2hash + 0x10,ntlm,&stack0xfffffffffffffb38,
                       (uint *)(ntresp + 0x10));
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    ntlmv2resp = puStack_4c8;
  }
  if (bVar8) {
    local_918 = local_918 << 1;
    domlen = domlen << 1;
    userlen = 0x16;
  }
  lmresp[0x14] = '@';
  lmresp[0x15] = '\0';
  lmresp[0x16] = '\0';
  lmresp[0x17] = '\0';
  ntresp[0x14] = 'X';
  ntresp[0x15] = '\0';
  ntresp[0x16] = '\0';
  ntresp[0x17] = '\0';
  uVar5 = ntresp._16_4_ + 0x58;
  lVar7 = uVar5 + local_918;
  uVar1 = (uint)(local_918 >> 8);
  uVar2 = (uint)(domlen >> 8);
  iVar6 = curl_msnprintf((char *)local_478,0x400,
                         "NTLMSSP%c\x03%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c"
                         ,0,0,0,0,0x18,0,0x18,0,0x40,0,0,0,ntresp._16_4_ & 0xff,
                         (uint)ntresp._16_4_ >> 8 & 0xff,ntresp._16_4_ & 0xff,
                         (uint)ntresp._16_4_ >> 8 & 0xff,0x58,0,0,0,(uint)local_918 & 0xff,
                         uVar1 & 0xff,(uint)local_918 & 0xff,uVar1 & 0xff,uVar5 & 0xff,
                         uVar5 >> 8 & 0xff,0,0,(uint)domlen & 0xff,uVar2 & 0xff,(uint)domlen & 0xff,
                         uVar2 & 0xff,(uint)lVar7 & 0xff,(uint)((ulong)lVar7 >> 8) & 0xff,0,0,
                         (int)userlen,0,(int)userlen,0,(uint)(lVar7 + domlen) & 0xff,
                         (uint)(lVar7 + domlen >> 8) & 0xff,0,0,0,0,0,0,0,0,0,0,ntlm->flags & 0xff,
                         ntlm->flags >> 8 & 0xff,ntlm->flags >> 0x10 & 0xff,ntlm->flags >> 0x18);
  local_70 = (ulong)iVar6;
  if (local_70 < 1000) {
    *(undefined8 *)(local_478 + local_70) = _ntresplen;
    *(undefined8 *)(ntlmbuf + local_70) = lmresp._0_8_;
    *(undefined8 *)(ntlmbuf + local_70 + 8) = lmresp._8_8_;
    local_70 = local_70 + 0x18;
  }
  if ((uint)ntresp._16_4_ + local_70 < 0x401) {
    memcpy(local_478 + local_70,ntlmv2resp,(ulong)(uint)ntresp._16_4_);
    lVar7 = (uint)ntresp._16_4_ + local_70;
    (*Curl_cfree)(puStack_4c8);
    if (lVar7 + domlen + local_918 + userlen < 0x400) {
      if (bVar8) {
        unicodecpy(local_478 + lVar7,(char *)hostoff,local_918 >> 1);
      }
      else {
        memcpy(local_478 + lVar7,(void *)hostoff,local_918);
      }
      lVar7 = local_918 + lVar7;
      if (bVar8) {
        unicodecpy(local_478 + lVar7,domain,domlen >> 1);
      }
      else {
        memcpy(local_478 + lVar7,domain,domlen);
      }
      lVar7 = domlen + lVar7;
      if (bVar8) {
        unicodecpy(local_478 + lVar7,(char *)&user,userlen >> 1);
      }
      else {
        memcpy(local_478 + lVar7,&user,userlen);
      }
      data_local._4_4_ = Curl_bufref_memdup(out,local_478,userlen + lVar7);
      Curl_auth_cleanup_ntlm(ntlm);
    }
    else {
      Curl_failf(data,"user + domain + host name too big");
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    Curl_failf(data,"incoming NTLM message too big");
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_auth_create_ntlm_type3_message(struct Curl_easy *data,
                                             const char *userp,
                                             const char *passwdp,
                                             struct ntlmdata *ntlm,
                                             struct bufref *out)
{
  /* NTLM type-3 message structure:

          Index  Description            Content
            0    NTLMSSP Signature      Null-terminated ASCII "NTLMSSP"
                                        (0x4e544c4d53535000)
            8    NTLM Message Type      long (0x03000000)
           12    LM/LMv2 Response       security buffer
           20    NTLM/NTLMv2 Response   security buffer
           28    Target Name            security buffer
           36    User Name              security buffer
           44    Workstation Name       security buffer
          (52)   Session Key            security buffer (*)
          (60)   Flags                  long (*)
          (64)   OS Version Structure   8 bytes (*)
  52 (64) (72)   Start of data block
                                          (*) -> Optional
  */

  CURLcode result = CURLE_OK;
  size_t size;
  unsigned char ntlmbuf[NTLM_BUFSIZE];
  int lmrespoff;
  unsigned char lmresp[24]; /* fixed-size */
  int ntrespoff;
  unsigned int ntresplen = 24;
  unsigned char ntresp[24]; /* fixed-size */
  unsigned char *ptr_ntresp = &ntresp[0];
  unsigned char *ntlmv2resp = NULL;
  bool unicode = (ntlm->flags & NTLMFLAG_NEGOTIATE_UNICODE) ? TRUE : FALSE;
  char host[HOSTNAME_MAX + 1] = "";
  const char *user;
  const char *domain = "";
  size_t hostoff = 0;
  size_t useroff = 0;
  size_t domoff = 0;
  size_t hostlen = 0;
  size_t userlen = 0;
  size_t domlen = 0;

  memset(lmresp, 0, sizeof(lmresp));
  memset(ntresp, 0, sizeof(ntresp));
  user = strchr(userp, '\\');
  if(!user)
    user = strchr(userp, '/');

  if(user) {
    domain = userp;
    domlen = (user - domain);
    user++;
  }
  else
    user = userp;

  userlen = strlen(user);

#ifndef NTLM_HOSTNAME
  /* Get the machine's un-qualified host name as NTLM doesn't like the fully
     qualified domain name */
  if(Curl_gethostname(host, sizeof(host))) {
    infof(data, "gethostname() failed, continuing without");
    hostlen = 0;
  }
  else {
    hostlen = strlen(host);
  }
#else
  (void)msnprintf(host, sizeof(host), "%s", NTLM_HOSTNAME);
  hostlen = sizeof(NTLM_HOSTNAME)-1;
#endif

  if(ntlm->flags & NTLMFLAG_NEGOTIATE_NTLM2_KEY) {
    unsigned char ntbuffer[0x18];
    unsigned char entropy[8];
    unsigned char ntlmv2hash[0x18];

    /* Full NTLM version 2
       Although this cannot be negotiated, it is used here if available, as
       servers featuring extended security are likely supporting also
       NTLMv2. */
    result = Curl_rand(data, entropy, 8);
    if(result)
      return result;

    result = Curl_ntlm_core_mk_nt_hash(passwdp, ntbuffer);
    if(result)
      return result;

    result = Curl_ntlm_core_mk_ntlmv2_hash(user, userlen, domain, domlen,
                                           ntbuffer, ntlmv2hash);
    if(result)
      return result;

    /* LMv2 response */
    result = Curl_ntlm_core_mk_lmv2_resp(ntlmv2hash, entropy,
                                         &ntlm->nonce[0], lmresp);
    if(result)
      return result;

    /* NTLMv2 response */
    result = Curl_ntlm_core_mk_ntlmv2_resp(ntlmv2hash, entropy,
                                           ntlm, &ntlmv2resp, &ntresplen);
    if(result)
      return result;

    ptr_ntresp = ntlmv2resp;
  }
  else {

    unsigned char ntbuffer[0x18];
    unsigned char lmbuffer[0x18];

    /* NTLM version 1 */

    result = Curl_ntlm_core_mk_nt_hash(passwdp, ntbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(ntbuffer, &ntlm->nonce[0], ntresp);

    result = Curl_ntlm_core_mk_lm_hash(passwdp, lmbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(lmbuffer, &ntlm->nonce[0], lmresp);
    ntlm->flags &= ~NTLMFLAG_NEGOTIATE_NTLM2_KEY;

    /* A safer but less compatible alternative is:
     *   Curl_ntlm_core_lm_resp(ntbuffer, &ntlm->nonce[0], lmresp);
     * See https://davenport.sourceforge.net/ntlm.html#ntlmVersion2 */
  }

  if(unicode) {
    domlen = domlen * 2;
    userlen = userlen * 2;
    hostlen = hostlen * 2;
  }

  lmrespoff = 64; /* size of the message header */
  ntrespoff = lmrespoff + 0x18;
  domoff = ntrespoff + ntresplen;
  useroff = domoff + domlen;
  hostoff = useroff + userlen;

  /* Create the big type-3 message binary blob */
  size = msnprintf((char *)ntlmbuf, NTLM_BUFSIZE,
                   NTLMSSP_SIGNATURE "%c"
                   "\x03%c%c%c"  /* 32-bit type = 3 */

                   "%c%c"  /* LanManager length */
                   "%c%c"  /* LanManager allocated space */
                   "%c%c"  /* LanManager offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* NT-response length */
                   "%c%c"  /* NT-response allocated space */
                   "%c%c"  /* NT-response offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* domain length */
                   "%c%c"  /* domain allocated space */
                   "%c%c"  /* domain name offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* user length */
                   "%c%c"  /* user allocated space */
                   "%c%c"  /* user offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* host length */
                   "%c%c"  /* host allocated space */
                   "%c%c"  /* host offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* session key length (unknown purpose) */
                   "%c%c"  /* session key allocated space (unknown purpose) */
                   "%c%c"  /* session key offset (unknown purpose) */
                   "%c%c"  /* 2 zeroes */

                   "%c%c%c%c",  /* flags */

                   /* domain string */
                   /* user string */
                   /* host string */
                   /* LanManager response */
                   /* NT response */

                   0,                /* null-termination */
                   0, 0, 0,          /* type-3 long, the 24 upper bits */

                   SHORTPAIR(0x18),  /* LanManager response length, twice */
                   SHORTPAIR(0x18),
                   SHORTPAIR(lmrespoff),
                   0x0, 0x0,

                   SHORTPAIR(ntresplen),  /* NT-response length, twice */
                   SHORTPAIR(ntresplen),
                   SHORTPAIR(ntrespoff),
                   0x0, 0x0,

                   SHORTPAIR(domlen),
                   SHORTPAIR(domlen),
                   SHORTPAIR(domoff),
                   0x0, 0x0,

                   SHORTPAIR(userlen),
                   SHORTPAIR(userlen),
                   SHORTPAIR(useroff),
                   0x0, 0x0,

                   SHORTPAIR(hostlen),
                   SHORTPAIR(hostlen),
                   SHORTPAIR(hostoff),
                   0x0, 0x0,

                   0x0, 0x0,
                   0x0, 0x0,
                   0x0, 0x0,
                   0x0, 0x0,

                   LONGQUARTET(ntlm->flags));

  DEBUGASSERT(size == 64);
  DEBUGASSERT(size == (size_t)lmrespoff);

  /* We append the binary hashes */
  if(size < (NTLM_BUFSIZE - 0x18)) {
    memcpy(&ntlmbuf[size], lmresp, 0x18);
    size += 0x18;
  }

  DEBUG_OUT({
    fprintf(stderr, "**** TYPE3 header lmresp=");
    ntlm_print_hex(stderr, (char *)&ntlmbuf[lmrespoff], 0x18);
  });

  /* ntresplen + size should not be risking an integer overflow here */
  if(ntresplen + size > sizeof(ntlmbuf)) {
    failf(data, "incoming NTLM message too big");
    return CURLE_OUT_OF_MEMORY;
  }
  DEBUGASSERT(size == (size_t)ntrespoff);
  memcpy(&ntlmbuf[size], ptr_ntresp, ntresplen);
  size += ntresplen;

  DEBUG_OUT({
    fprintf(stderr, "\n   ntresp=");
    ntlm_print_hex(stderr, (char *)&ntlmbuf[ntrespoff], ntresplen);
  });

  free(ntlmv2resp);/* Free the dynamic buffer allocated for NTLMv2 */

  DEBUG_OUT({
    fprintf(stderr, "\n   flags=0x%02.2x%02.2x%02.2x%02.2x 0x%08.8x ",
            LONGQUARTET(ntlm->flags), ntlm->flags);
    ntlm_print_flags(stderr, ntlm->flags);
    fprintf(stderr, "\n****\n");
  });

  /* Make sure that the domain, user and host strings fit in the
     buffer before we copy them there. */
  if(size + userlen + domlen + hostlen >= NTLM_BUFSIZE) {
    failf(data, "user + domain + host name too big");
    return CURLE_OUT_OF_MEMORY;
  }

  DEBUGASSERT(size == domoff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], domain, domlen / 2);
  else
    memcpy(&ntlmbuf[size], domain, domlen);

  size += domlen;

  DEBUGASSERT(size == useroff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], user, userlen / 2);
  else
    memcpy(&ntlmbuf[size], user, userlen);

  size += userlen;

  DEBUGASSERT(size == hostoff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], host, hostlen / 2);
  else
    memcpy(&ntlmbuf[size], host, hostlen);

  size += hostlen;

  /* Return the binary blob. */
  result = Curl_bufref_memdup(out, ntlmbuf, size);

  Curl_auth_cleanup_ntlm(ntlm);

  return result;
}